

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

Statement *
slang::ast::Statement::bindBlock
          (StatementBlockSymbol *block,SyntaxNode *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  ulong uVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  RsCodeBlockSyntax *pRVar5;
  reference ppSVar6;
  StatementSyntax *pSVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 in_RCX;
  StatementContext *in_RDX;
  ASTContext *in_RSI;
  BlockStatementSyntax *in_RDI;
  Statement *stmt_1;
  StatementSyntax *ss;
  SmallVector<const_slang::ast::Statement_*,_5UL> buffer_1;
  Statement *stmt;
  SyntaxNode *item;
  iterator __end4;
  iterator __begin4;
  SyntaxList<slang::syntax::SyntaxNode> *__range4;
  SmallVector<const_slang::ast::Statement_*,_5UL> buffer;
  Statement *bs;
  BlockStatementSyntax *bss;
  Compilation *comp;
  bool anyBad;
  BlockStatement *result;
  StatementContext *in_stack_fffffffffffffe28;
  Compilation *in_stack_fffffffffffffe30;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  StatementSyntax *in_stack_fffffffffffffe58;
  StatementBlockKind blocKind;
  PatternCaseItemSyntax *in_stack_fffffffffffffe60;
  SmallVectorBase<const_slang::ast::Statement_*> *in_stack_fffffffffffffe68;
  SmallVectorBase<const_slang::ast::Statement_*> *buffer_00;
  Compilation *in_stack_fffffffffffffe70;
  Statement *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  pointer in_stack_fffffffffffffe98;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffea0;
  SmallVectorBase<const_slang::ast::Statement_*> *in_stack_fffffffffffffeb8;
  ASTContext *in_stack_fffffffffffffec0;
  StatementSyntax *local_128;
  SmallVectorBase<const_slang::ast::Statement_*> local_120 [2];
  Statement *local_e0;
  Statement *local_d8;
  SyntaxNode *local_d0;
  SyntaxNode **local_c8;
  __normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
  local_c0;
  SyntaxList<slang::syntax::SyntaxNode> *local_b8;
  Statement *local_50;
  BlockStatementSyntax *local_48;
  Compilation *local_40;
  byte local_31;
  Compilation *local_30;
  socklen_t local_28;
  Compilation *in_stack_fffffffffffffff8;
  
  local_31 = 0;
  local_40 = ASTContext::getCompilation((ASTContext *)0x93023c);
  if ((*(SyntaxKind *)&(in_RSI->scope).ptr == SequentialBlockStatement) ||
     (*(SyntaxKind *)&(in_RSI->scope).ptr == ParallelBlockStatement)) {
    local_48 = slang::syntax::SyntaxNode::as<slang::syntax::BlockStatementSyntax>
                         ((SyntaxNode *)in_RSI);
    uVar1 = (ulong)in_RCX >> 0x38;
    local_50 = BlockStatement::fromSyntax
                         (in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX,SUB81(uVar1,0));
    bVar2 = bad(local_50);
    if (bVar2) {
      return local_50;
    }
    local_30 = (Compilation *)as<slang::ast::BlockStatement>(local_50);
    ((Statement *)&local_30->super_BumpAllocator)->syntax = &local_48->super_StatementSyntax;
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
    span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
               CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe38);
    syntax_00._M_extent._M_extent_value = in_stack_fffffffffffffea0._M_extent_value;
    syntax_00._M_ptr = in_stack_fffffffffffffe98;
    ASTContext::setAttributes
              ((ASTContext *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88,syntax_00);
  }
  else if (*(SyntaxKind *)&(in_RSI->scope).ptr == RsCodeBlock) {
    SmallVector<const_slang::ast::Statement_*,_5UL>::SmallVector
              ((SmallVector<const_slang::ast::Statement_*,_5UL> *)0x93038a);
    bindScopeInitializers(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    pRVar5 = slang::syntax::SyntaxNode::as<slang::syntax::RsCodeBlockSyntax>((SyntaxNode *)in_RSI);
    local_b8 = &pRVar5->items;
    local_c0._M_current =
         (SyntaxNode **)
         std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>::begin
                   ((span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> *)
                    in_stack_fffffffffffffe28);
    local_c8 = (SyntaxNode **)
               std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>::end
                         ((span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> *)
                          in_stack_fffffffffffffe38);
    while (bVar2 = __gnu_cxx::
                   operator==<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                             ((__normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffe30,
                              (__normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffe28), ((bVar2 ^ 0xffU) & 1) != 0) {
      ppSVar6 = __gnu_cxx::
                __normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                ::operator*(&local_c0);
      local_d0 = *ppSVar6;
      bVar2 = slang::syntax::StatementSyntax::isKind(local_d0->kind);
      if (bVar2) {
        pSVar7 = slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>(local_d0);
        iVar4 = bind((int)pSVar7,(sockaddr *)in_RDX,(socklen_t)in_RCX);
        local_e0 = (Statement *)CONCAT44(extraout_var,iVar4);
        local_d8 = local_e0;
        SmallVectorBase<const_slang::ast::Statement_*>::push_back
                  ((SmallVectorBase<const_slang::ast::Statement_*> *)in_stack_fffffffffffffe30,
                   (Statement **)in_stack_fffffffffffffe28);
        bVar2 = bad(local_d8);
        local_31 = (local_31 & 1) != 0 || bVar2;
      }
      __gnu_cxx::
      __normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
      ::operator++(&local_c0);
    }
    local_30 = (Compilation *)
               createBlockStatement
                         (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                          (SyntaxNode *)in_stack_fffffffffffffe60,
                          (StatementBlockKind)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    SmallVector<const_slang::ast::Statement_*,_5UL>::~SmallVector
              ((SmallVector<const_slang::ast::Statement_*,_5UL> *)0x930575);
  }
  else {
    buffer_00 = local_120;
    SmallVector<const_slang::ast::Statement_*,_5UL>::SmallVector
              ((SmallVector<const_slang::ast::Statement_*,_5UL> *)0x93058c);
    bindScopeInitializers(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if (*(int *)&(in_RSI->scope).ptr == 0x16d) {
      in_stack_fffffffffffffe60 =
           slang::syntax::SyntaxNode::as<slang::syntax::PatternCaseItemSyntax>((SyntaxNode *)in_RSI)
      ;
      in_stack_fffffffffffffe58 =
           not_null::operator_cast_to_StatementSyntax_
                     ((not_null<slang::syntax::StatementSyntax_*> *)0x9305d2);
      local_128 = in_stack_fffffffffffffe58;
    }
    else {
      local_128 = slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>
                            ((SyntaxNode *)in_RSI);
    }
    blocKind = (StatementBlockKind)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    iVar4 = bind((int)local_128,(sockaddr *)in_RDX,local_28);
    SmallVectorBase<const_slang::ast::Statement_*>::push_back
              ((SmallVectorBase<const_slang::ast::Statement_*> *)in_stack_fffffffffffffe30,
               (Statement **)in_stack_fffffffffffffe28);
    uVar3 = bad((Statement *)CONCAT44(extraout_var_00,iVar4));
    local_31 = local_31 & 1 | uVar3;
    in_stack_fffffffffffffe28 = in_RDX;
    in_stack_fffffffffffffe30 =
         (Compilation *)
         createBlockStatement
                   (in_stack_fffffffffffffe70,buffer_00,(SyntaxNode *)in_stack_fffffffffffffe60,
                    blocKind);
    ((Statement *)&in_stack_fffffffffffffe30->super_BumpAllocator)->syntax = local_128;
    local_30 = in_stack_fffffffffffffe30;
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
    span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
               CONCAT17(uVar3,in_stack_fffffffffffffe40),
               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffe30);
    syntax_01._M_extent._M_extent_value = in_stack_fffffffffffffea0._M_extent_value;
    syntax_01._M_ptr = in_stack_fffffffffffffe98;
    ASTContext::setAttributes
              ((ASTContext *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88,syntax_01);
    SmallVector<const_slang::ast::Statement_*,_5UL>::~SmallVector
              ((SmallVector<const_slang::ast::Statement_*,_5UL> *)0x93075e);
  }
  *(BlockStatementSyntax **)&(local_30->options).maxConstexprBacktrace = in_RDI;
  if ((local_31 & 1) != 0) {
    local_30 = (Compilation *)
               badStmt(in_stack_fffffffffffffe30,(Statement *)in_stack_fffffffffffffe28);
  }
  return (Statement *)local_30;
}

Assistant:

const Statement& Statement::bindBlock(const StatementBlockSymbol& block, const SyntaxNode& syntax,
                                      const ASTContext& context, StatementContext& stmtCtx) {
    BlockStatement* result;
    bool anyBad = false;
    auto& comp = context.getCompilation();

    if (syntax.kind == SyntaxKind::SequentialBlockStatement ||
        syntax.kind == SyntaxKind::ParallelBlockStatement) {
        auto& bss = syntax.as<BlockStatementSyntax>();
        auto& bs = BlockStatement::fromSyntax(comp, bss, context, stmtCtx,
                                              /* addInitializers */ true);
        if (bs.bad())
            return bs;

        result = &bs.as<BlockStatement>();
        result->syntax = &bss;
        context.setAttributes(*result, bss.attributes);
    }
    else if (syntax.kind == SyntaxKind::RsCodeBlock) {
        SmallVector<const Statement*> buffer;
        bindScopeInitializers(context, buffer);

        for (auto item : syntax.as<RsCodeBlockSyntax>().items) {
            if (StatementSyntax::isKind(item->kind)) {
                auto& stmt = bind(item->as<StatementSyntax>(), context, stmtCtx,
                                  /* inList */ true);
                buffer.push_back(&stmt);
                anyBad |= stmt.bad();
            }
        }

        result = createBlockStatement(comp, buffer, syntax);
    }
    else {
        SmallVector<const Statement*> buffer;
        bindScopeInitializers(context, buffer);

        const StatementSyntax* ss;
        if (syntax.kind == SyntaxKind::PatternCaseItem)
            ss = syntax.as<PatternCaseItemSyntax>().statement;
        else
            ss = &syntax.as<StatementSyntax>();
        auto& stmt = bind(*ss, context, stmtCtx, /* inList */ false,
                          /* labelHandled */ true);
        buffer.push_back(&stmt);
        anyBad |= stmt.bad();

        result = createBlockStatement(comp, buffer, syntax);
        result->syntax = ss;
        context.setAttributes(*result, ss->attributes);
    }

    result->blockSymbol = &block;
    if (anyBad)
        return badStmt(comp, result);

    return *result;
}